

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

ssize_t zip_entries_deletebyindex(zip_t *zip,size_t *entries,size_t len)

{
  uint entry_num;
  int iVar1;
  zip_modify_t zVar2;
  mz_bool mVar3;
  zip_entry_mark_t *entry_mark;
  mz_uint64 mVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  ulong __nmemb;
  ssize_t sVar8;
  size_t index;
  bool bVar9;
  mz_zip_archive_file_stat local_488;
  
  sVar8 = -1;
  if ((zip != (zip_t *)0x0) && (entries != (size_t *)0x0 || len == 0)) {
    if (entries == (size_t *)0x0 && len == 0) {
      sVar8 = 0;
    }
    else {
      entry_num = (zip->archive).m_total_files;
      __nmemb = (ulong)entry_num;
      entry_mark = (zip_entry_mark_t *)calloc(__nmemb,0x20);
      if (entry_mark == (zip_entry_mark_t *)0x0) {
        sVar8 = -0x15;
      }
      else {
        (zip->archive).m_zip_mode = MZ_ZIP_MODE_READING;
        if (entries == (size_t *)0x0) {
          sVar8 = -1;
        }
        else {
          if (__nmemb != 0) {
            uVar7 = 0xffffffffffffffff;
            index = 0;
            do {
              iVar1 = zip_entry_openbyindex(zip,index);
              if (iVar1 != 0) {
                sVar8 = (ssize_t)iVar1;
                goto LAB_00110855;
              }
              zVar2 = MZ_KEEP;
              if (len == 0) {
                bVar9 = false;
              }
              else {
                sVar5 = 0;
                do {
                  bVar9 = index == entries[sVar5];
                  if (bVar9) {
                    zVar2 = MZ_DELETE;
                    break;
                  }
                  sVar5 = sVar5 + 1;
                } while (len != sVar5);
              }
              entry_mark[index].type = zVar2;
              mVar3 = mz_zip_reader_file_stat(&zip->archive,(mz_uint)index,&local_488);
              if (mVar3 == 0) {
                sVar8 = -3;
                goto LAB_00110855;
              }
              zip_entry_close(zip);
              entry_mark[index].m_local_header_ofs = local_488.m_local_header_ofs;
              entry_mark[index].file_index = -1;
              entry_mark[index].lf_length = 0;
              mVar4 = local_488.m_local_header_ofs;
              if (uVar7 < local_488.m_local_header_ofs) {
                mVar4 = uVar7;
              }
              if (bVar9) {
                uVar7 = mVar4;
              }
              index = index + 1;
            } while (index != __nmemb);
            lVar6 = 0;
            do {
              if ((uVar7 < *(ulong *)((long)&entry_mark->m_local_header_ofs + lVar6)) &&
                 (*(int *)((long)&entry_mark->type + lVar6) != 1)) {
                *(undefined4 *)((long)&entry_mark->type + lVar6) = 2;
              }
              lVar6 = lVar6 + 0x20;
            } while (__nmemb << 5 != lVar6);
          }
          iVar1 = zip_entry_finalize(zip,entry_mark,__nmemb);
          if (iVar1 < 0) {
            sVar8 = (ssize_t)iVar1;
          }
          else {
            sVar8 = zip_entries_delete_mark(zip,entry_mark,entry_num);
          }
        }
LAB_00110855:
        free(entry_mark);
      }
    }
  }
  return sVar8;
}

Assistant:

ssize_t zip_entries_deletebyindex(struct zip_t *zip, size_t entries[],
                                  size_t len) {
  ssize_t n = 0;
  ssize_t err = 0;
  struct zip_entry_mark_t *entry_mark = NULL;

  if (zip == NULL || (entries == NULL && len != 0)) {
    return ZIP_ENOINIT;
  }

  if (entries == NULL && len == 0) {
    return 0;
  }

  n = zip_entries_total(zip);
  if (n < 0) {
    return n;
  }

  entry_mark = (struct zip_entry_mark_t *)calloc(
      (size_t)n, sizeof(struct zip_entry_mark_t));
  if (!entry_mark) {
    return ZIP_EOOMEM;
  }

  zip->archive.m_zip_mode = MZ_ZIP_MODE_READING;

  err = zip_entry_setbyindex(zip, entry_mark, (size_t)n, entries, len);
  if (err < 0) {
    CLEANUP(entry_mark);
    return err;
  }

  err = zip_entries_delete_mark(zip, entry_mark, (int)n);
  CLEANUP(entry_mark);
  return err;
}